

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

http_request_method parse_request_method(sub_string *text)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  http_parsing_error *this;
  sub_string local_20;
  
  bVar1 = sub_string::empty(text);
  if (bVar1) {
    this = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(this,"empty request-line");
  }
  else {
    sVar2 = sub_string::size(text);
    if (sVar2 < 3) {
      this = (http_parsing_error *)__cxa_allocate_exception(0x10);
      http_parsing_error::http_parsing_error(this,"invalid request method");
    }
    else {
      pcVar3 = sub_string::operator[](text,0);
      switch(*pcVar3) {
      case 'C':
        sub_string::sub_string(&local_20,"CONNECT","");
        bVar1 = sub_string::try_drop_prefix(text,local_20);
        if (bVar1) {
          return CONNECT;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
        break;
      case 'D':
        sub_string::sub_string(&local_20,"DELETE","");
        bVar1 = sub_string::try_drop_prefix(text,local_20);
        if (bVar1) {
          return DELETE;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
        break;
      case 'G':
        sub_string::sub_string(&local_20,"GET","");
        bVar1 = sub_string::try_drop_prefix(text,local_20);
        if (bVar1) {
          return GET;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
        break;
      case 'H':
        sub_string::sub_string(&local_20,"HEAD","");
        bVar1 = sub_string::try_drop_prefix(text,local_20);
        if (bVar1) {
          return HEAD;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
        break;
      case 'O':
        sub_string::sub_string(&local_20,"OPTIONS","");
        bVar1 = sub_string::try_drop_prefix(text,local_20);
        if (bVar1) {
          return OPTIONS;
        }
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
        break;
      case 'P':
        pcVar3 = sub_string::operator[](text,1);
        if (*pcVar3 == 'O') {
          sub_string::sub_string(&local_20,"POST","");
          bVar1 = sub_string::try_drop_prefix(text,local_20);
          if (bVar1) {
            return POST;
          }
          this = (http_parsing_error *)__cxa_allocate_exception(0x10);
          http_parsing_error::http_parsing_error(this,"invalid request method");
        }
        else if (*pcVar3 == 'U') {
          sub_string::sub_string(&local_20,"PUT","");
          bVar1 = sub_string::try_drop_prefix(text,local_20);
          if (bVar1) {
            return PUT;
          }
          this = (http_parsing_error *)__cxa_allocate_exception(0x10);
          http_parsing_error::http_parsing_error(this,"invalid request method");
        }
        else {
          this = (http_parsing_error *)__cxa_allocate_exception(0x10);
          http_parsing_error::http_parsing_error(this,"invalid request method");
        }
        break;
      default:
        if (*pcVar3 == 'T') {
          sub_string::sub_string(&local_20,"TRACE","");
          bVar1 = sub_string::try_drop_prefix(text,local_20);
          if (bVar1) {
            return TRACE;
          }
          this = (http_parsing_error *)__cxa_allocate_exception(0x10);
          http_parsing_error::http_parsing_error(this,"invalid request method");
          break;
        }
      case 'E':
      case 'F':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
        this = (http_parsing_error *)__cxa_allocate_exception(0x10);
        http_parsing_error::http_parsing_error(this,"invalid request method");
      }
    }
  }
  __cxa_throw(this,&http_parsing_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

http_request_method parse_request_method(sub_string& text)
{
    if (text.empty())
        throw http_parsing_error("empty request-line");

    if (text.size() < 3)
        throw http_parsing_error("invalid request method");

    switch (text[0])
    {
    case 'O':
        if (!text.try_drop_prefix(sub_string::literal("OPTIONS")))
            throw http_parsing_error("invalid request method");
        return http_request_method::OPTIONS;
    case 'G':
        if (!text.try_drop_prefix(sub_string::literal("GET")))
            throw http_parsing_error("invalid request method");
        return http_request_method::GET;
    case 'H':
        if (!text.try_drop_prefix(sub_string::literal("HEAD")))
            throw http_parsing_error("invalid request method");
        return http_request_method::HEAD;
    case 'P':
        switch (text[1])
        {
        case 'U':
            if (!text.try_drop_prefix(sub_string::literal("PUT")))
                throw http_parsing_error("invalid request method");
            return http_request_method::PUT;
        case 'O':
            if (!text.try_drop_prefix(sub_string::literal("POST")))
                throw http_parsing_error("invalid request method");
            return http_request_method::POST;
        default:
            throw http_parsing_error("invalid request method");
        }
    case 'D':
        if (!text.try_drop_prefix(sub_string::literal("DELETE")))
            throw http_parsing_error("invalid request method");
        return http_request_method::DELETE;
    case 'T':
        if (!text.try_drop_prefix(sub_string::literal("TRACE")))
            throw http_parsing_error("invalid request method");
        return http_request_method::TRACE;
    case 'C':
        if (!text.try_drop_prefix(sub_string::literal("CONNECT")))
            throw http_parsing_error("invalid request method");
        return http_request_method::CONNECT;
    default:
        throw http_parsing_error("invalid request method");
    }
}